

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QString,_QChar>,_const_char_(&)[12]>,_ProString>::
convertTo<QString>(QString *__return_storage_ptr__,
                  QStringBuilder<QStringBuilder<QStringBuilder<QString,_QChar>,_const_char_(&)[12]>,_ProString>
                  *this)

{
  long lVar1;
  char16_t *__dest;
  QChar *__dest_00;
  CutResult CVar2;
  long lVar3;
  char16_t *pcVar4;
  char16_t *__src;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QChar *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->a).a.a.d.size + 0xc + (long)(this->b).m_length;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar1,Uninitialized);
  __dest = (__return_storage_ptr__->d).ptr;
  lVar3 = (this->a).a.a.d.size;
  if (lVar3 != 0) {
    pcVar4 = (this->a).a.a.d.ptr;
    if (pcVar4 == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QString::_empty;
    }
    memcpy(__dest,pcVar4,lVar3 * 2);
  }
  local_50 = (QChar *)(__dest + lVar3 + 1);
  __dest[lVar3] = (this->a).a.b.ucs;
  QVar5.m_data = *(this->a).b;
  QVar5.m_size = 0xb;
  QAbstractConcatenable::convertFromUtf8(QVar5,&local_50);
  __dest_00 = local_50;
  lVar3 = (long)(this->b).m_length;
  if (lVar3 != 0) {
    pcVar4 = (this->b).m_string.d.ptr;
    local_40 = (long)(this->b).m_offset;
    local_48 = lVar3;
    CVar2 = QtPrivate::QContainerImplHelper::mid((this->b).m_string.d.size,&local_40,&local_48);
    __src = (char16_t *)0x0;
    if (CVar2 != Null) {
      __src = pcVar4 + local_40;
    }
    memcpy(__dest_00,__src,lVar3 * 2);
    local_50 = local_50 + lVar3;
  }
  if (lVar1 != (long)local_50 - (long)__dest >> 1) {
    QString::resize((longlong)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }